

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

xmlRegAtomPtr xmlRegNewAtom(xmlRegParserCtxtPtr ctxt,xmlRegAtomType type)

{
  xmlRegAtomPtr ret;
  xmlRegAtomType type_local;
  xmlRegParserCtxtPtr ctxt_local;
  
  ctxt_local = (xmlRegParserCtxtPtr)(*xmlMalloc)(0x60);
  if (ctxt_local == (xmlRegParserCtxtPtr)0x0) {
    xmlRegexpErrMemory(ctxt);
    ctxt_local = (xmlRegParserCtxtPtr)0x0;
  }
  else {
    memset(ctxt_local,0,0x60);
    *(xmlRegAtomType *)((long)&ctxt_local->string + 4) = type;
    *(undefined4 *)&ctxt_local->cur = 2;
    *(undefined4 *)((long)&ctxt_local->cur + 4) = 0;
    ctxt_local->error = 0;
  }
  return (xmlRegAtomPtr)ctxt_local;
}

Assistant:

static xmlRegAtomPtr
xmlRegNewAtom(xmlRegParserCtxtPtr ctxt, xmlRegAtomType type) {
    xmlRegAtomPtr ret;

    ret = (xmlRegAtomPtr) xmlMalloc(sizeof(xmlRegAtom));
    if (ret == NULL) {
	xmlRegexpErrMemory(ctxt);
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlRegAtom));
    ret->type = type;
    ret->quant = XML_REGEXP_QUANT_ONCE;
    ret->min = 0;
    ret->max = 0;
    return(ret);
}